

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void s390x_tr_translate_insn(DisasContextBase *dcbase,CPUState *cs)

{
  CPUS390XState_conflict *env;
  target_ulong tVar1;
  DisasJumpType DVar2;
  undefined1 *puVar3;
  target_ulong local_18;
  
  env = (CPUS390XState_conflict *)cs->env_ptr;
  local_18 = dcbase->pc_next;
  tVar1 = dcbase[3].pc_first;
  if (*(int *)(tVar1 + 0x57c) == 0) {
    if (*(target_ulong *)(tVar1 + 0x578 + (long)*(int *)(tVar1 + 0x39e0) * 8) == local_18)
    goto LAB_00cba421;
  }
  else {
    puVar3 = (undefined1 *)g_tree_lookup(*(GTree **)(tVar1 + 0x780),&local_18);
    if (puVar3 == &DAT_00000001) {
LAB_00cba421:
      dcbase->is_jmp = DISAS_TARGET_11;
      return;
    }
  }
  DVar2 = translate_one(env,(DisasContext_conflict13 *)dcbase);
  dcbase->is_jmp = DVar2;
  if ((DVar2 == DISAS_NEXT) &&
     ((0xfff < dcbase->pc_next - (dcbase->pc_first & 0xfffffffffffff000) || (dcbase[2].pc_next != 0)
      ))) {
    dcbase->is_jmp = DISAS_TOO_MANY;
  }
  return;
}

Assistant:

static void s390x_tr_translate_insn(DisasContextBase *dcbase, CPUState *cs)
{
    CPUS390XState *env = cs->env_ptr;
    DisasContext *dc = container_of(dcbase, DisasContext, base);

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(dc->uc, dcbase->pc_next)) {
        // imitate PGM exception to halt emulation
        dcbase->is_jmp = DISAS_UNICORN_HALT;
    } else {
        dc->base.is_jmp = translate_one(env, dc);
        if (dc->base.is_jmp == DISAS_NEXT) {
            uint64_t page_start;

            page_start = dc->base.pc_first & TARGET_PAGE_MASK;
            if (dc->base.pc_next - page_start >= TARGET_PAGE_SIZE || dc->ex_value) {
                dc->base.is_jmp = DISAS_TOO_MANY;
            }
        }
    }
}